

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O1

void __thiscall
dtc::fdt::checking::check_manager::add_property_size_checker
          (check_manager *this,char *name,string *prop,uint32_t size)

{
  property_checker *this_00;
  allocator<char> local_71;
  uint *local_70;
  undefined8 local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  uint *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  property_checker *local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_71);
  this_00 = (property_checker *)operator_new(0x50);
  property_checker::property_checker(this_00,name,prop);
  (this_00->super_checker)._vptr_checker = (_func_int **)&PTR__property_checker_00148ea0;
  *(uint32_t *)&this_00[1].super_checker._vptr_checker = size;
  if (local_70 == &local_60) {
    uStack_38 = uStack_58;
    uStack_34 = uStack_54;
    local_50 = (uint *)&local_40;
  }
  else {
    local_50 = local_70;
  }
  local_40 = CONCAT44(uStack_5c,local_60);
  local_48 = local_68;
  local_68 = 0;
  local_60 = local_60 & 0xffffff00;
  local_70 = &local_60;
  local_30 = this_00;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string,dtc::fdt::checking::property_size_checker*>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this);
  if (local_50 != (uint *)&local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT44(uStack_5c,local_60) + 1);
  }
  return;
}

Assistant:

void
check_manager::add_property_size_checker(const char *name,
                                         const string &prop,
                                         uint32_t size)
{
	checkers.insert(std::make_pair(string(name),
		new property_size_checker(name, prop, size)));
}